

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Box.H
# Opt level: O1

void __thiscall Fl_Box::~Fl_Box(Fl_Box *this)

{
  Fl_Widget::~Fl_Widget(&this->super_Fl_Widget);
  operator_delete(this,0x78);
  return;
}

Assistant:

class FL_EXPORT Fl_Box : public Fl_Widget {
protected:
  void draw();
public:
  /**
    - The first constructor sets box() to FL_NO_BOX, which
    means it is invisible. However such widgets are useful as placeholders
    or Fl_Group::resizable()
    values.  To change the box to something visible, use box(n).
    - The second form of the constructor sets the box to the specified box
    type.
    <P>The destructor removes the box.
  */
  Fl_Box(int X, int Y, int W, int H, const char *l=0);
  
  /**    See Fl_Box::Fl_Box(int x, int y, int w, int h, const char * = 0)   */
  Fl_Box(Fl_Boxtype b, int X, int Y, int W, int H, const char *l);

  virtual int handle(int);
}